

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O1

QLibraryScanResult __thiscall
QElfParser::parse(QElfParser *this,QByteArrayView data,QString *errMsg)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Elf64_Half *pEVar4;
  Ehdr *header;
  bool bVar5;
  Elf64_Half *pEVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QByteArrayView data_00;
  QLibraryScanResult QVar14;
  QString local_d0;
  QString local_b8;
  ErrorMaker local_a0;
  QString local_98;
  QString local_80;
  QString local_68;
  QString local_50;
  long local_38;
  
  local_a0.errMsg = (QString *)data.m_data;
  data_00.m_data = (Ehdr *)data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this < (QElfParser *)0x40) {
    QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,"file too small",(char *)0x0,-1);
    anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
    parse((QElfParser *)&local_50);
  }
  else if ((((*(int *)(data_00.m_data)->e_ident == 0x464c457f) &&
            ((data_00.m_data)->e_ident[4] == '\x02')) && ((data_00.m_data)->e_ident[5] == '\x01'))
          && ((((data_00.m_data)->e_ident[6] == '\x01' && ((data_00.m_data)->e_type == 3)) &&
              (((data_00.m_data)->e_machine == 0x3e && ((data_00.m_data)->e_version == 1)))))) {
    if ((data_00.m_data)->e_phentsize == 0x38) {
      uVar3 = (ulong)(data_00.m_data)->e_phnum;
      if (uVar3 == 0xffff) {
        QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                        "unimplemented: PN_XNUM program headers",(char *)0x0,-1);
        anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
        parse((QElfParser *)&local_50);
      }
      else {
        uVar2 = uVar3 * 0x38;
        uVar10 = (data_00.m_data)->e_phoff;
        if ((CARRY8(uVar2,uVar10)) || (this < (QElfParser *)(uVar2 + uVar10))) {
          QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                          "program header table extends past the end of the file",(char *)0x0,-1);
          anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
          parse((QElfParser *)&local_50);
        }
        else {
          bVar13 = uVar3 == 0;
          if (bVar13) {
            bVar5 = false;
          }
          else {
            lVar11 = 0;
            bVar5 = false;
            bVar13 = false;
            do {
              uVar3 = *(ulong *)((data_00.m_data)->e_ident + lVar11 + uVar10 + 8);
              uVar9 = *(ulong *)((data_00.m_data)->e_ident + lVar11 + uVar10 + 0x20);
              if ((CARRY8(uVar3,uVar9)) || (this < (QElfParser *)(uVar3 + uVar9))) {
                QMetaObject::tr(&local_50,&QLibrary::staticMetaObject,
                                "a program header entry extends past the end of the file",
                                (char *)0x0,-1);
                anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
                parse((QElfParser *)&local_50);
                break;
              }
              if (*(int *)((data_00.m_data)->e_ident + lVar11 + uVar10) == 4) {
                uVar9 = *(ulong *)((data_00.m_data)->e_ident + lVar11 + uVar10 + 0x30) - 1;
                if ((uVar9 < (*(ulong *)((data_00.m_data)->e_ident + lVar11 + uVar10 + 0x30) ^ uVar9
                             )) && ((uVar9 & uVar3) != 0)) {
                  QMetaObject::tr(&local_80,&QLibrary::staticMetaObject,
                                  "a note segment start is not properly aligned (offset 0x%1, alignment %2)"
                                  ,(char *)0x0,-1);
                  QString::arg_impl(&local_68,&local_80,
                                    *(qulonglong *)((data_00.m_data)->e_ident + lVar11 + 8 + uVar10)
                                    ,6,0x10,(QChar)0x30);
                  QString::arg_impl(&local_50,&local_68,
                                    *(qulonglong *)
                                     ((data_00.m_data)->e_ident + lVar11 + 0x30 + uVar10),0,10,
                                    (QChar)0x20);
                  anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
                  parse();
                  break;
                }
              }
              else if (((*(int *)((data_00.m_data)->e_ident + lVar11 + uVar10) == 1) && (uVar9 != 0)
                       ) && (((data_00.m_data)->e_ident[lVar11 + uVar10 + 4] & 1) != 0)) {
                bVar5 = true;
              }
              lVar11 = lVar11 + 0x38;
              bVar13 = uVar2 - lVar11 == 0;
            } while (!bVar13);
          }
          if (bVar13) {
            if (bVar5) {
              if ((ulong)(data_00.m_data)->e_phnum == 0) {
                uVar3 = 0;
                lVar11 = 0;
              }
              else {
                pEVar4 = (Elf64_Half *)((data_00.m_data)->e_ident + (data_00.m_data)->e_phoff);
                pEVar6 = pEVar4 + (ulong)(data_00.m_data)->e_phnum * 0x1c;
                uVar3 = 0;
                lVar11 = 0;
                do {
                  if (((*(int *)pEVar4 == 4) && (*(long *)(pEVar4 + 0x18) == 8)) &&
                     (-1 < (long)*(Elf64_Off *)(pEVar4 + 0x10))) {
                    uVar2 = *(Elf64_Off *)(pEVar4 + 0x10) + *(ulong *)(pEVar4 + 4);
                    uVar10 = *(ulong *)(pEVar4 + 4);
                    do {
                      if ((long)(uVar2 - uVar10) < 0x22) goto LAB_004a6403;
                      uVar1 = *(uint *)((data_00.m_data)->e_ident + uVar10);
                      iVar7 = 3;
                      uVar9 = uVar10;
                      if (!CARRY8(uVar10 + 0x11,(ulong)uVar1)) {
                        uVar12 = (ulong)*(uint *)((data_00.m_data)->e_ident + uVar10 + 4);
                        uVar8 = uVar10 + 0x11 + (ulong)uVar1 & 0xfffffffffffffff8 | 5;
                        if (((!CARRY8(uVar8,uVar12)) &&
                            (uVar8 = uVar8 + uVar12 & 0xfffffffffffffff8, uVar8 <= uVar2)) &&
                           ((iVar7 = 0, uVar9 = uVar8, uVar1 == 0xc &&
                            (((5 < *(uint *)((data_00.m_data)->e_ident + uVar10 + 4) &&
                              (*(int *)((data_00.m_data)->e_ident + uVar10 + 8) == 0x74510001)) &&
                             (*(int *)((data_00.m_data)->e_ident + uVar10 + 0x14) == 0x217463 &&
                              *(long *)((data_00.m_data)->e_ident + uVar10 + 0xc) ==
                              0x656a6f72702d7471)))))) {
                          lVar11 = uVar10 + 0x18;
                          iVar7 = 1;
                          uVar3 = uVar12;
                          uVar9 = uVar10;
                        }
                      }
                      uVar10 = uVar9;
                    } while (iVar7 == 0);
                    if (iVar7 != 3) break;
                  }
LAB_004a6403:
                  pEVar4 = pEVar4 + 0x1c;
                } while (pEVar4 != pEVar6);
              }
              QVar14.length = uVar3;
              QVar14.pos = lVar11;
              if (uVar3 != 0) goto LAB_004a67ed;
              if ((data_00.m_data)->e_shentsize == 0x40) {
                if (((data_00.m_data)->e_shoff == 0) || ((data_00.m_data)->e_shnum == 0)) {
                  anon_unknown.dwarf_18ad1e3::ErrorMaker::notfound(&local_a0);
                }
                else {
                  if ((data_00.m_data)->e_shstrndx < (data_00.m_data)->e_shnum) {
                    data_00.m_size = (qsizetype)this;
                    QVar14 = ::scanSections(data_00,&local_a0);
                    goto LAB_004a67ed;
                  }
                  QMetaObject::tr(&local_d0,&QLibrary::staticMetaObject,
                                  "e_shstrndx greater than the number of sections e_shnum (%1 >= %2)"
                                  ,(char *)0x0,-1);
                  QString::arg_impl(&local_b8,&local_d0,(ulong)(data_00.m_data)->e_shstrndx,0,10,
                                    (QChar)0x20);
                  QString::arg_impl(&local_98,&local_b8,(ulong)(data_00.m_data)->e_shnum,0,10,
                                    (QChar)0x20);
                  anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_98);
                  parse();
                }
              }
              else {
                QMetaObject::tr(&local_b8,&QLibrary::staticMetaObject,
                                "unexpected section entry size (%1)",(char *)0x0,-1);
                QString::arg_impl(&local_98,&local_b8,(ulong)(data_00.m_data)->e_shentsize,0,10,
                                  (QChar)0x20);
                anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_98);
                parse();
              }
            }
            else {
              QMetaObject::tr(&local_98,&QLibrary::staticMetaObject,"file has no code",(char *)0x0,
                              -1);
              anon_unknown.dwarf_18ad1e3::ErrorMaker::notplugin(&local_a0,&local_98);
              parse((QElfParser *)&local_98);
            }
          }
        }
      }
    }
    else {
      QMetaObject::tr(&local_68,&QLibrary::staticMetaObject,
                      "unexpected program header entry size (%1)",(char *)0x0,-1);
      QString::arg_impl(&local_50,&local_68,(ulong)(data_00.m_data)->e_phentsize,0,10,(QChar)0x20);
      anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
      parse();
    }
  }
  else {
    anon_unknown.dwarf_18ad1e3::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
    explainCheckFailure(&local_50,data_00.m_data);
    anon_unknown.dwarf_18ad1e3::ErrorMaker::operator()(&local_a0,&local_50);
    parse((QElfParser *)&local_50);
  }
  QVar14 = (QLibraryScanResult)ZEXT816(0);
LAB_004a67ed:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar14;
  }
  __stack_chk_fail();
}

Assistant:

QLibraryScanResult QElfParser::parse(QByteArrayView data, QString *errMsg)
{
    ErrorMaker error(errMsg);
    if (size_t(data.size()) < sizeof(T::Ehdr)) {
        qEDebug << "file too small:" << size_t(data.size());
        return error(QLibrary::tr("file too small"));
    }

    qEDebug << ElfHeaderDebug{ reinterpret_cast<const uchar *>(data.data()) };

    auto header = reinterpret_cast<const T::Ehdr *>(data.data());
    if (!ElfHeaderCheck<>::checkHeader(*header))
        return error(ElfHeaderCheck<>::explainCheckFailure(*header));

    qEDebug << "contains" << header->e_phnum << "program headers of"
            << header->e_phentsize << "bytes at offset" << header->e_phoff;
    qEDebug << "contains" << header->e_shnum << "sections of" << header->e_shentsize
            << "bytes at offset" << header->e_shoff
            << "; section header string table (shstrtab) is entry" << header->e_shstrndx;

    // some sanity checks
    if constexpr (IncludeValidityChecks) {
        if (header->e_phentsize != sizeof(T::Phdr))
            return error(QLibrary::tr("unexpected program header entry size (%1)")
                         .arg(header->e_phentsize));
    }

    if (!preScanProgramHeaders(data, error))
        return {};

    if (QLibraryScanResult r = scanProgramHeadersForNotes(data, error); r.length)
        return r;

    if (!ElfNotesAreMandatory) {
        if constexpr (IncludeValidityChecks) {
            if (header->e_shentsize != sizeof(T::Shdr))
                return error(QLibrary::tr("unexpected section entry size (%1)")
                             .arg(header->e_shentsize));
        }
        if (header->e_shoff == 0 || header->e_shnum == 0) {
            // this is still a valid ELF file but we don't have a section table
            qEDebug << "no section table present, not able to find Qt metadata";
            return error.notfound();
        }

        if (header->e_shnum && header->e_shstrndx >= header->e_shnum)
            return error(QLibrary::tr("e_shstrndx greater than the number of sections e_shnum (%1 >= %2)")
                         .arg(header->e_shstrndx).arg(header->e_shnum));
        return scanSections(data, error);
    }
    return error.notfound();
}